

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space_mixer.c
# Opt level: O2

void calculate_volumes(space_source *source,space_mixer_data *data)

{
  mixed_channel_t c;
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  float fVar4;
  float fVar5;
  mixed_channel_t speaker_count;
  mixed_channel_t speakers [33];
  float volumes [33];
  byte local_f5;
  float local_f4;
  float local_f0;
  float fStack_ec;
  float local_e8;
  float local_e0;
  float local_dc;
  byte local_d8 [48];
  float local_a8 [34];
  
  local_e0 = source->min_distance;
  fVar4 = source->max_distance;
  local_f0 = (float)*(undefined8 *)source->location - (float)*(undefined8 *)data->location;
  fStack_ec = (float)((ulong)*(undefined8 *)source->location >> 0x20) -
              (float)((ulong)*(undefined8 *)data->location >> 0x20);
  local_e8 = source->location[2] - data->location[2];
  local_f4 = SQRT(local_e8 * local_e8 + local_f0 * local_f0 + fStack_ec * fStack_ec);
  if (fVar4 <= local_f4) {
    local_f4 = fVar4;
  }
  local_dc = 1.0;
  if ((local_e0 < local_f4) && (local_e0 < fVar4)) {
    local_dc = (*data->attenuation)(local_e0,fVar4,local_f4,source->rolloff);
  }
  if (source->spatial == true) {
    vec_mul(&local_f0,data->look_at,&local_f0);
    if (local_f4 < local_e0) {
      fVar5 = 1.0 - local_f4 / local_e0;
      fVar5 = fVar5 + fVar5;
      fVar4 = 1.0;
      if (fVar5 <= 1.0) {
        fVar4 = fVar5;
      }
      fVar5 = 1.0 - fVar4;
      local_f0 = fVar4 * 0.0 + fVar5 * local_f0;
      fStack_ec = fVar4 * 0.0 + fVar5 * fStack_ec;
      local_e8 = fVar5 * local_e8 + fVar4;
    }
    mixed_compute_gains_resolver(&local_f0,local_a8,local_d8,&local_f5,&data->vbap);
    uVar3 = (uint)local_f5;
    for (uVar1 = 0; local_f5 != uVar1; uVar1 = uVar1 + 1) {
      fVar4 = 1.0;
      if (local_a8[uVar1] * local_dc <= 1.0) {
        fVar4 = local_a8[uVar1] * local_dc;
      }
      local_a8[uVar1] = fVar4;
    }
    if ((local_e0 < local_f4) && (data->surround == false)) {
      fVar4 = calculate_phase(&local_f0);
      if (fVar4 < 0.0) {
        for (uVar1 = 0; local_f5 != uVar1; uVar1 = uVar1 + 1) {
          uVar2 = (ulong)(data->channels).positions[local_d8[uVar1]];
          if ((uVar2 < 0x21) && ((0x122020202U >> (uVar2 & 0x3f) & 1) != 0)) {
            local_a8[uVar1] = -local_a8[uVar1];
          }
        }
      }
    }
  }
  else {
    local_f0 = 0.0;
    fStack_ec = 0.0;
    local_e8 = 0.0;
    mixed_compute_gains_resolver(&local_f0,local_a8,local_d8,&local_f5,&data->vbap);
    uVar3 = (uint)local_f5;
    for (uVar1 = 0; local_f5 != uVar1; uVar1 = uVar1 + 1) {
      fVar4 = 1.0;
      if (local_a8[uVar1] * local_dc <= 1.0) {
        fVar4 = local_a8[uVar1] * local_dc;
      }
      local_a8[uVar1] = fVar4;
    }
  }
  memcpy(source->volumes,local_a8,(ulong)(uVar3 << 2));
  memcpy(source->speakers,local_d8,(ulong)(uVar3 << 2));
  source->speaker_count = local_f5;
  return;
}

Assistant:

VECTORIZE static void calculate_volumes(struct space_source *source, struct space_mixer_data *data){
  float volumes[MIXED_MAX_SPEAKER_COUNT];
  mixed_channel_t speakers[MIXED_MAX_SPEAKER_COUNT];
  mixed_channel_t speaker_count;
  float forward[3] = {0.0, 0.0, 1.0};
  float min = source->min_distance;
  float max = source->max_distance;
  float roll = source->rolloff;
  // Relative location to our listener
  float location[3] = {source->location[0]-data->location[0],
                       source->location[1]-data->location[1],
                       source->location[2]-data->location[2]};
  float distance = MIN(vec_length(location), max);
  float volume = 1.0;
  if(min < distance && min < max){
    volume *= data->attenuation(min, max, distance, roll);
  }
  if(source->spatial){
    // Bring the location into our reference frame
    vec_mul(location, data->look_at, location);
    // If we are below min distance, bend towards forward
    if(distance < min){
      vec_lerp(location, location, forward, MIN(1.0, (1-distance/min)*2));
    }
    // Compute the actual gain factors using VBAP
    mixed_compute_gains(location, volumes, speakers, &speaker_count, &data->vbap);
    for(mixed_channel_t c=0; c<speaker_count; ++c){
      volumes[c] = MIN(1.0, volume*volumes[c]);
    }
    // If we are not on a surround setup, we can simulate the sound appearing
    // from behind by inverting the right channels, causing a phase shift.
    // Only do this when the sound is far enough away though as otherwise it
    // can lead to frequent fluctuations, which sound very... bad.
    if(!data->surround && min < distance && calculate_phase(location) < 0){
      for(mixed_channel_t c=0; c<speaker_count; ++c){
        switch(data->channels.positions[speakers[c]]){
        case MIXED_RIGHT_FRONT_BOTTOM:
        case MIXED_RIGHT_FRONT_TOP:
        case MIXED_RIGHT_FRONT_WIDE:
        case MIXED_RIGHT_FRONT_HIGH:
        case MIXED_RIGHT_CENTER_BOTTOM:
        case MIXED_RIGHT_FRONT_CENTER_BOTTOM:
          volumes[c] *= -1.0;
        }
      }
    }
  }else{
    location[0] = 0.0;
    location[1] = 0.0;
    location[2] = 0.0;
    mixed_compute_gains(location, volumes, speakers, &speaker_count, &data->vbap);
    for(mixed_channel_t c=0; c<speaker_count; ++c){
      volumes[c] = MIN(1.0, volume*volumes[c]);
    }
  }
  // Cache
  memcpy(source->volumes, volumes, sizeof(float)*speaker_count);
  memcpy(source->speakers, speakers, sizeof(float)*speaker_count);
  source->speaker_count = speaker_count;
}